

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86_fma::forward_int8
          (Gemm_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *B;
  pointer pMVar1;
  Mat *this_00;
  Mat *A;
  void *pvVar2;
  void *pvVar3;
  uint broadcast_type_C;
  int max_kk;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float max_kk_00;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int *piVar20;
  Gemm_x86_fma *pGVar21;
  int k;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  size_t sVar28;
  uint uVar29;
  bool bVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  float B_int8_scale;
  int TILE_K;
  ulong local_348;
  ulong local_338;
  Gemm_x86_fma *local_330;
  ulong local_328;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  Mat m_3;
  Mat m_1;
  Mat local_258;
  int TILE_K_2;
  Mat m;
  Mat local_1b8;
  Mat local_168;
  Mat m_2;
  float B_int8_scale_1;
  ulong local_d0;
  int TILE_M;
  int *local_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  int local_a0;
  int local_9c;
  undefined8 local_98;
  int local_90;
  size_t local_88;
  int local_7c;
  int TILE_N;
  int *local_70;
  size_t local_68;
  int local_60;
  Allocator *local_58;
  int local_50;
  int local_4c;
  undefined8 local_48;
  int local_40;
  size_t local_38;
  
  iVar15 = (this->super_Gemm).constantA;
  iVar10 = (this->super_Gemm).constantB;
  if (iVar10 != 0 && iVar15 != 0) {
    uVar8 = (this->super_Gemm).constantM;
LAB_004badc9:
    uVar29 = (this->super_Gemm).constantN;
  }
  else {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar15 == 0) {
      iVar13 = (this->super_Gemm).transA;
      if (iVar10 != 0) {
        if (iVar13 == 0) {
          uVar8 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
        }
        else {
          uVar8 = pMVar1->w;
        }
        goto LAB_004badc9;
      }
      if (iVar13 == 0) {
        uVar8 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar8 = pMVar1->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar29 = pMVar1[1].w;
      }
      else {
        uVar29 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
      }
    }
    else {
      uVar8 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar29 = pMVar1->w;
      }
      else {
        uVar29 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
    }
  }
  local_258.cstep = 0;
  uVar31 = 0;
  uVar32 = 0;
  local_258.data = (void *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize._0_4_ = 0;
  local_258.elemsize._4_4_ = 0;
  local_258.elempack = 0;
  local_258.allocator = (Allocator *)0x0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258.c = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    local_330 = this;
    if (iVar10 != 0 && iVar15 != 0) {
      bVar30 = true;
      if (lVar22 == 0x48) {
        local_258.data = pMVar1->data;
        piVar20 = pMVar1->refcount;
        sVar28 = pMVar1->elemsize;
        local_258.elempack = pMVar1->elempack;
        local_258.allocator = pMVar1->allocator;
        uVar31._0_4_ = pMVar1->dims;
        uVar31._4_4_ = pMVar1->w;
        uVar32._0_4_ = pMVar1->h;
        uVar32._4_4_ = pMVar1->d;
        local_258.c = pMVar1->c;
        local_258.cstep = pMVar1->cstep;
        if (piVar20 == (int *)0x0) {
          piVar20 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          bVar30 = false;
        }
      }
      else {
        local_258.allocator = (Allocator *)0x0;
        local_258.elempack = 0;
        sVar28 = 0;
        piVar20 = (int *)0x0;
        local_258.data = (void *)0x0;
        local_258.c = 0;
        local_258.cstep = 0;
      }
      local_258.refcount._0_4_ = SUB84(piVar20,0);
      local_258.refcount._4_4_ = (undefined4)((ulong)piVar20 >> 0x20);
      local_258.elemsize._0_4_ = (undefined4)sVar28;
      local_258.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
      local_258.dims = (int)uVar31;
      local_258.w = (int)((ulong)uVar31 >> 0x20);
      local_258.h = (int)uVar32;
      local_258.d = (int)((ulong)uVar32 >> 0x20);
      if (!bVar30) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_258.allocator == (Allocator *)0x0) goto LAB_004bdb6e;
          (*(local_258.allocator)->_vptr_Allocator[3])(local_258.allocator,local_258.data);
        }
      }
    }
    else if (iVar15 == 0) {
      if (iVar10 == 0) {
        bVar30 = true;
        if (lVar22 == 0xd8) {
          local_258.data = pMVar1[2].data;
          piVar20 = pMVar1[2].refcount;
          sVar28 = pMVar1[2].elemsize;
          local_258.elempack = pMVar1[2].elempack;
          local_258.allocator = pMVar1[2].allocator;
          uVar31._0_4_ = pMVar1[2].dims;
          uVar31._4_4_ = pMVar1[2].w;
          uVar32._0_4_ = pMVar1[2].h;
          uVar32._4_4_ = pMVar1[2].d;
          local_258.c = pMVar1[2].c;
          local_258.cstep = pMVar1[2].cstep;
          if (piVar20 == (int *)0x0) {
            piVar20 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            bVar30 = false;
          }
        }
        else {
          local_258.cstep = 0;
          local_258.c = 0;
          local_258.allocator = (Allocator *)0x0;
          local_258.elempack = 0;
          sVar28 = 0;
          piVar20 = (int *)0x0;
          local_258.data = (void *)0x0;
        }
        local_258.refcount._0_4_ = SUB84(piVar20,0);
        local_258.refcount._4_4_ = (undefined4)((ulong)piVar20 >> 0x20);
        local_258.elemsize._0_4_ = (undefined4)sVar28;
        local_258.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
        local_258.dims = (int)uVar31;
        local_258.w = (int)((ulong)uVar31 >> 0x20);
        local_258.h = (int)uVar32;
        local_258.d = (int)((ulong)uVar32 >> 0x20);
        if (!bVar30) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_258.allocator == (Allocator *)0x0) goto LAB_004bdb6e;
            (*(local_258.allocator)->_vptr_Allocator[3])(local_258.allocator,local_258.data);
          }
        }
      }
      else {
        bVar30 = true;
        if (lVar22 == 0x90) {
          local_258.data = pMVar1[1].data;
          piVar20 = pMVar1[1].refcount;
          sVar28 = pMVar1[1].elemsize;
          local_258.elempack = pMVar1[1].elempack;
          local_258.allocator = pMVar1[1].allocator;
          uVar31._0_4_ = pMVar1[1].dims;
          uVar31._4_4_ = pMVar1[1].w;
          uVar32._0_4_ = pMVar1[1].h;
          uVar32._4_4_ = pMVar1[1].d;
          local_258.c = pMVar1[1].c;
          local_258.cstep = pMVar1[1].cstep;
          if (piVar20 == (int *)0x0) {
            piVar20 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            bVar30 = false;
          }
        }
        else {
          local_258.cstep = 0;
          local_258.c = 0;
          local_258.allocator = (Allocator *)0x0;
          local_258.elempack = 0;
          sVar28 = 0;
          piVar20 = (int *)0x0;
          local_258.data = (void *)0x0;
        }
        local_258.refcount._0_4_ = SUB84(piVar20,0);
        local_258.refcount._4_4_ = (undefined4)((ulong)piVar20 >> 0x20);
        local_258.elemsize._0_4_ = (undefined4)sVar28;
        local_258.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
        local_258.dims = (int)uVar31;
        local_258.w = (int)((ulong)uVar31 >> 0x20);
        local_258.h = (int)uVar32;
        local_258.d = (int)((ulong)uVar32 >> 0x20);
        if (!bVar30) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_258.allocator == (Allocator *)0x0) {
LAB_004bdb6e:
              if (local_258.data != (void *)0x0) {
                free(local_258.data);
              }
            }
            else {
              (*(local_258.allocator)->_vptr_Allocator[3])(local_258.allocator,local_258.data);
            }
          }
        }
      }
    }
    else {
      bVar30 = true;
      if (lVar22 == 0x90) {
        local_258.data = pMVar1[1].data;
        piVar20 = pMVar1[1].refcount;
        sVar28 = pMVar1[1].elemsize;
        local_258.elempack = pMVar1[1].elempack;
        local_258.allocator = pMVar1[1].allocator;
        uVar31._0_4_ = pMVar1[1].dims;
        uVar31._4_4_ = pMVar1[1].w;
        uVar32._0_4_ = pMVar1[1].h;
        uVar32._4_4_ = pMVar1[1].d;
        local_258.c = pMVar1[1].c;
        local_258.cstep = pMVar1[1].cstep;
        if (piVar20 == (int *)0x0) {
          piVar20 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          bVar30 = false;
        }
      }
      else {
        local_258.cstep = 0;
        local_258.c = 0;
        local_258.allocator = (Allocator *)0x0;
        local_258.elempack = 0;
        sVar28 = 0;
        piVar20 = (int *)0x0;
        local_258.data = (void *)0x0;
      }
      local_258.refcount._0_4_ = SUB84(piVar20,0);
      local_258.refcount._4_4_ = (undefined4)((ulong)piVar20 >> 0x20);
      local_258.elemsize._0_4_ = (undefined4)sVar28;
      local_258.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
      local_258.dims = (int)uVar31;
      local_258.w = (int)((ulong)uVar31 >> 0x20);
      local_258.h = (int)uVar32;
      local_258.d = (int)((ulong)uVar32 >> 0x20);
      if (!bVar30) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_258.allocator == (Allocator *)0x0) goto LAB_004bdb6e;
          (*(local_258.allocator)->_vptr_Allocator[3])(local_258.allocator,local_258.data);
        }
      }
    }
    pGVar21 = local_330;
    broadcast_type_C = 0;
    if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0)) {
      if (local_258.dims == 1) {
        broadcast_type_C = 4;
        if (local_258.w * local_258.elempack != uVar29) {
          broadcast_type_C = (uint)(local_258.w * local_258.elempack == uVar8);
        }
      }
      else {
        bVar30 = local_258.dims == 2;
        broadcast_type_C = 0;
        if (local_258.w == 1U && bVar30) {
          broadcast_type_C = (uint)(local_258.elempack * local_258.h == uVar8) * 2;
        }
        if ((local_258.w == 1U && bVar30 || bVar30) && (local_258.w == uVar29)) {
          if (local_258.elempack * local_258.h == uVar8) {
            broadcast_type_C = 3;
          }
          if (local_258.elempack * local_258.h == 1) {
            broadcast_type_C = 4;
          }
        }
      }
    }
  }
  else {
    if (&local_258 != &this->CT_data) {
      piVar20 = (this->CT_data).refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      local_258.data = (this->CT_data).data;
      piVar20 = (this->CT_data).refcount;
      local_258.refcount._0_4_ = SUB84(piVar20,0);
      local_258.refcount._4_4_ = (undefined4)((ulong)piVar20 >> 0x20);
      sVar28 = (this->CT_data).elemsize;
      local_258.elemsize._0_4_ = (undefined4)sVar28;
      local_258.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
      local_258.elempack = (this->CT_data).elempack;
      local_258.allocator = (this->CT_data).allocator;
      uVar4 = (this->CT_data).dims;
      uVar5 = (this->CT_data).w;
      uVar6 = (this->CT_data).h;
      uVar7 = (this->CT_data).d;
      local_258.c = (this->CT_data).c;
      local_258.cstep = (this->CT_data).cstep;
      local_258.dims = uVar4;
      local_258.w = uVar5;
      local_258.h = uVar6;
      local_258.d = uVar7;
    }
    pGVar21 = this;
    broadcast_type_C = (this->super_Gemm).constant_broadcast_type_C;
  }
  iVar15 = (pGVar21->super_Gemm).output_transpose;
  iVar10 = 1;
  if (opt->use_packing_layout == true) {
    uVar26 = uVar29;
    if (iVar15 == 0) {
      uVar26 = uVar8;
    }
    iVar10 = 8;
    if ((uVar26 & 7) != 0) {
      iVar10 = (uint)((uVar26 & 3) == 0) * 3 + 1;
    }
  }
  iVar13 = (pGVar21->super_Gemm).output_elempack;
  if (iVar13 != 0) {
    iVar10 = iVar13;
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar26 = uVar29;
  if (iVar15 != 0) {
    uVar26 = uVar8;
    uVar8 = uVar29;
  }
  if ((pGVar21->super_Gemm).output_N1M == 0) {
    Mat::create(this_00,uVar26,(int)uVar8 / iVar10,(ulong)(uint)(iVar10 * 4),iVar10,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar26,1,(int)uVar8 / iVar10,(ulong)(uint)(iVar10 * 4),iVar10,
                opt->blob_allocator);
  }
  iVar15 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004bde4a;
  iVar15 = *(int *)&(pGVar21->super_Gemm).field_0x244;
  iVar10 = iVar15;
  if (iVar15 == 0) {
    iVar10 = opt->num_threads;
  }
  if (opt->num_threads != iVar15 && iVar15 != 0) {
    forward_int8();
  }
  iVar15 = (pGVar21->super_Gemm).constantA;
  iVar13 = (pGVar21->super_Gemm).constantB;
  if (iVar13 == 0 || iVar15 == 0) {
    A = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
    if (iVar15 == 0) {
      if (iVar13 == 0) {
        iVar15 = (pGVar21->super_Gemm).transA;
        iVar13 = (pGVar21->super_Gemm).transB;
        local_338 = CONCAT44(local_338._4_4_,iVar15);
        if (iVar15 == 0) {
          iVar9 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
          iVar24 = A->w;
        }
        else {
          iVar9 = A->w;
          iVar24 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
        }
        if (iVar13 == 0) {
          uVar8 = A[1].w;
        }
        else {
          uVar8 = A[1].elempack * (&A[1].h)[(ulong)(A[1].dims == 3) * 2];
        }
        local_310 = (ulong)(uint)(pGVar21->super_Gemm).output_transpose;
        fVar16 = (pGVar21->super_Gemm).alpha;
        local_318 = CONCAT44(local_318._4_4_,(pGVar21->super_Gemm).beta);
        get_optimal_tile_mnk_int8
                  (iVar9,uVar8,iVar24,(pGVar21->super_Gemm).constant_TILE_M,
                   (pGVar21->super_Gemm).constant_TILE_N,(pGVar21->super_Gemm).constant_TILE_K,
                   &TILE_K,(int *)&B_int8_scale,&TILE_K_2,iVar10);
        iVar25 = TILE_K_2;
        uVar29 = TILE_K;
        local_328 = CONCAT44(local_328._4_4_,(iVar9 + TILE_K + -1) / TILE_K);
        local_348 = (ulong)(uint)B_int8_scale;
        iVar12 = (int)(uVar8 + (int)B_int8_scale + -1) / (int)B_int8_scale;
        iVar14 = (TILE_K_2 + iVar24 + -1) / TILE_K_2;
        local_1b8.cstep = 0;
        local_1b8.data = (Mat *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        local_320 = (ulong)uVar8;
        if (TILE_K_2 < 4) {
LAB_004bc7ce:
          Mat::create(&local_1b8,iVar25 * uVar29,iVar14,iVar10,1,opt->workspace_allocator);
        }
        else {
          iVar15 = cpu_support_x86_avx512_vnni();
          bVar30 = true;
          if (iVar15 == 0) {
            iVar15 = cpu_support_x86_avx_vnni();
            bVar30 = iVar15 != 0;
          }
          iVar15 = cpu_support_x86_avx_vnni_int8();
          if (!(bool)(bVar30 & iVar15 == 0)) goto LAB_004bc7ce;
          iVar15 = 0x40;
          if ((((int)uVar29 < 0x10) && (iVar15 = 0x20, (int)uVar29 < 8)) &&
             (iVar15 = 0x10, (int)uVar29 < 4)) {
            iVar15 = (uint)(1 < (int)uVar29) * 4 + 4;
          }
          Mat::create(&local_1b8,(iVar15 + iVar25) * uVar29,iVar14,iVar10,1,opt->workspace_allocator
                     );
        }
        iVar15 = -100;
        if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
          local_168.cstep = 0;
          local_168.data = (Mat *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          Mat::create(&local_168,iVar25 * (int)local_348,iVar14,iVar12,1,opt->workspace_allocator);
          iVar15 = -100;
          if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            Mat::create(&m_3,iVar9,4,opt->workspace_allocator);
            iVar15 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              B = A + 1;
              compute_B_int8_scale(B,&B_int8_scale_1);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,iVar9,4,opt->workspace_allocator);
              iVar15 = -100;
              if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                iVar12 = iVar14 * iVar12;
                if (0 < iVar12) {
                  iVar15 = 0;
                  do {
                    iVar9 = (int)B_int8_scale * (iVar15 / iVar14);
                    iVar25 = TILE_K_2 * (int)((long)iVar15 % (long)iVar14);
                    fVar27 = (float)((int)local_320 - iVar9);
                    if ((int)B_int8_scale < (int)fVar27) {
                      fVar27 = B_int8_scale;
                    }
                    iVar23 = iVar24 - iVar25;
                    if (TILE_K_2 < iVar24 - iVar25) {
                      iVar23 = TILE_K_2;
                    }
                    m_1.cstep = (size_t)local_168.w;
                    m_1.data = (void *)((long)(void **)local_168.data +
                                       ((long)iVar15 % (long)iVar14 & 0xffffffffU) * m_1.cstep *
                                       CONCAT44(local_168.elemsize._4_4_,
                                                (undefined4)local_168.elemsize) +
                                       (long)(iVar15 / iVar14) * local_168.cstep *
                                       CONCAT44(local_168.elemsize._4_4_,
                                                (undefined4)local_168.elemsize));
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)local_168.elemsize;
                    m_1.elemsize._4_4_ = local_168.elemsize._4_4_;
                    m_1.elempack = local_168.elempack;
                    m_1.allocator = local_168.allocator;
                    m_1.dims = 2;
                    m_1.w = local_168.w;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    if (iVar13 == 0) {
                      transpose_pack_B_tile_quantize
                                (B,&m_1,iVar9,(int)fVar27,iVar25,iVar23,B_int8_scale_1);
                    }
                    else {
                      pack_B_tile_quantize(B,&m_1,iVar9,(int)fVar27,iVar25,iVar23,B_int8_scale_1);
                    }
                    piVar20 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar20 != (int *)0x0) {
                      LOCK();
                      *piVar20 = *piVar20 + -1;
                      UNLOCK();
                      if (*piVar20 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    iVar15 = iVar15 + 1;
                  } while (iVar12 != iVar15);
                  local_348 = (ulong)(uint)B_int8_scale;
                  uVar29 = TILE_K;
                }
                uVar18 = local_348;
                local_d0 = (ulong)uVar29;
                m_1.cstep = 0;
                m_1.data = (void *)0x0;
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = 0;
                m_1.elemsize._4_4_ = 0;
                m_1.elempack = 0;
                m_1.allocator = (Allocator *)0x0;
                m_1.dims = 0;
                m_1.w = 0;
                m_1.h = 0;
                m_1.d = 0;
                m_1.c = 0;
                Mat::create(&m_1,(int)local_348 * uVar29,1,iVar10,4,opt->workspace_allocator);
                iVar15 = -100;
                if ((m_1.data != (void *)0x0) && ((long)m_1.c * m_1.cstep != 0)) {
                  if (0 < (int)(float)local_328) {
                    iVar15 = 0;
                    do {
                      if ((int)local_338 == 0) {
                        iVar10 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                        iVar13 = A->w;
                      }
                      else {
                        iVar10 = A->w;
                        iVar13 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                      }
                      local_330 = (Gemm_x86_fma *)CONCAT44(local_330._4_4_,iVar13);
                      iVar9 = (int)local_d0;
                      iVar24 = iVar15 * iVar9;
                      iVar13 = iVar10 - iVar24;
                      if (iVar9 < iVar10 - iVar24) {
                        iVar13 = iVar9;
                      }
                      iVar10 = get_omp_thread_num();
                      m_2.elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
                      m_2.data = (void *)((long)iVar10 * m_1.cstep * m_2.elemsize + (long)m_1.data);
                      m_2.refcount = (int *)0x0;
                      m_2.elempack = m_1.elempack;
                      m_2.allocator = m_1.allocator;
                      m_2.w = m_1.w;
                      m_2.d = 1;
                      m_2.h = m_1.h;
                      m_2.c = m_1.d;
                      m_2.dims = m_1.dims + -1;
                      m_2.cstep = (m_2.elemsize * (long)m_1.h * (long)m_1.w + 0xf &
                                  0xfffffffffffffff0) / m_2.elemsize;
                      if (m_1.dims == 4) {
                        m_2.cstep = (long)m_1.h * (long)m_1.w;
                      }
                      if (0 < (int)(float)local_320) {
                        iVar10 = 0;
                        do {
                          iVar9 = (int)local_320 - iVar10;
                          if ((int)uVar18 < iVar9) {
                            iVar9 = (int)uVar18;
                          }
                          if (0 < (int)local_330) {
                            iVar12 = 0;
                            iVar25 = (int)local_330;
                            do {
                              iVar14 = iVar25;
                              if (TILE_K_2 < iVar25) {
                                iVar14 = TILE_K_2;
                              }
                              iVar23 = get_omp_thread_num();
                              local_88 = (size_t)local_1b8.w;
                              local_b8 = CONCAT44(local_1b8.elemsize._4_4_,
                                                  (undefined4)local_1b8.elemsize);
                              _TILE_M = (void *)((long)(void **)local_1b8.data +
                                                local_b8 * local_88 * (long)(iVar12 / TILE_K_2) +
                                                (long)iVar23 * local_1b8.cstep * local_b8);
                              local_38 = (size_t)local_168.w;
                              local_68 = CONCAT44(local_168.elemsize._4_4_,
                                                  (undefined4)local_168.elemsize);
                              _TILE_N = (void *)((long)(void **)local_168.data +
                                                local_38 * local_68 * (long)(iVar12 / TILE_K_2) +
                                                (long)(iVar10 / (int)local_348) * local_168.cstep *
                                                local_68);
                              local_c0 = (int *)0x0;
                              local_b0 = local_1b8.elempack;
                              local_a8 = local_1b8.allocator;
                              local_a0 = 2;
                              local_9c = local_1b8.w;
                              local_98._0_4_ = 1;
                              local_98._4_4_ = 1;
                              local_90 = 1;
                              local_70 = (int *)0x0;
                              local_60 = local_168.elempack;
                              local_58 = local_168.allocator;
                              local_50 = 2;
                              local_4c = local_168.w;
                              local_48._0_4_ = 1;
                              local_48._4_4_ = 1;
                              local_40 = 1;
                              if (iVar10 == 0) {
                                if (iVar12 == 0) {
                                  if ((int)local_338 != 0) {
                                    transpose_compute_A_tile_int8_scales
                                              (A,(Mat *)m_3.data,B_int8_scale_1,(Mat *)m.data,iVar24
                                               ,iVar13);
                                    goto LAB_004bcee2;
                                  }
                                  compute_A_tile_int8_scales
                                            (A,(Mat *)m_3.data,B_int8_scale_1,(Mat *)m.data,iVar24,
                                             iVar13);
                                }
                                else if ((int)local_338 != 0) {
LAB_004bcee2:
                                  transpose_pack_A_tile_quantize
                                            (A,(Mat *)&TILE_M,iVar24,iVar13,iVar12,iVar14,&m_3);
                                  goto LAB_004bcf60;
                                }
                                pack_A_tile_quantize
                                          (A,(Mat *)&TILE_M,iVar24,iVar13,iVar12,iVar14,&m_3);
                              }
LAB_004bcf60:
                              gemm_transB_packed_tile_int8
                                        ((Mat *)&TILE_M,(Mat *)&TILE_N,&m_2,iVar24,iVar13,iVar10,
                                         iVar9,iVar12,iVar14);
                              if (local_70 != (int *)0x0) {
                                LOCK();
                                *local_70 = *local_70 + -1;
                                UNLOCK();
                                if (*local_70 == 0) {
                                  if (local_58 == (Allocator *)0x0) {
                                    if (_TILE_N != (void *)0x0) {
                                      free(_TILE_N);
                                    }
                                  }
                                  else {
                                    (*local_58->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              if (local_c0 != (int *)0x0) {
                                LOCK();
                                *local_c0 = *local_c0 + -1;
                                UNLOCK();
                                if (*local_c0 == 0) {
                                  if (local_a8 == (Allocator *)0x0) {
                                    if (_TILE_M != (void *)0x0) {
                                      free(_TILE_M);
                                    }
                                  }
                                  else {
                                    (*local_a8->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              iVar12 = iVar12 + TILE_K_2;
                              iVar25 = iVar25 - TILE_K_2;
                            } while (iVar12 < (int)local_330);
                          }
                          unpack_output_tile_dequantize
                                    (&m_2,&local_258,this_00,broadcast_type_C,iVar24,iVar13,iVar10,
                                     iVar9,&m,fVar16,(float)local_318,(int)local_310);
                          uVar18 = local_348;
                          iVar10 = iVar10 + (int)local_348;
                        } while (iVar10 < (int)local_320);
                        if (m_2.refcount != (int *)0x0) {
                          LOCK();
                          *m_2.refcount = *m_2.refcount + -1;
                          UNLOCK();
                          if (*m_2.refcount == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      iVar15 = iVar15 + 1;
                    } while ((float)iVar15 != (float)local_328);
                  }
                  iVar15 = 0;
                }
                piVar20 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar20 != (int *)0x0) {
                  LOCK();
                  *piVar20 = *piVar20 + -1;
                  UNLOCK();
                  if (*piVar20 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      if (m_1.data != (void *)0x0) {
                        free(m_1.data);
                      }
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              piVar20 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar20 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar20 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if ((Mat *)local_168.data != (Mat *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar20 == (int *)0x0) goto LAB_004bde4a;
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 != 0) goto LAB_004bde4a;
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          goto LAB_004bde4a;
        }
      }
      else {
        iVar15 = (pGVar21->super_Gemm).constantN;
        local_310 = CONCAT44(local_310._4_4_,iVar15);
        iVar13 = (pGVar21->super_Gemm).constantK;
        iVar9 = (pGVar21->super_Gemm).transA;
        local_338 = CONCAT44(local_338._4_4_,iVar9);
        if (iVar9 == 0) {
          iVar9 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
        }
        else {
          iVar9 = A->w;
        }
        local_320 = CONCAT44(local_320._4_4_,(pGVar21->super_Gemm).B_data_int8_scale);
        iVar24 = (pGVar21->super_Gemm).output_transpose;
        local_318 = CONCAT44(local_318._4_4_,(pGVar21->super_Gemm).alpha);
        local_328 = CONCAT44(local_328._4_4_,(pGVar21->super_Gemm).beta);
        get_optimal_tile_mnk_int8
                  (iVar9,iVar15,iVar13,(pGVar21->super_Gemm).constant_TILE_M,
                   (pGVar21->super_Gemm).constant_TILE_N,(pGVar21->super_Gemm).constant_TILE_K,
                   &TILE_N,&TILE_K,(int *)&B_int8_scale,iVar10);
        iVar25 = TILE_N;
        local_d0 = CONCAT44(local_d0._4_4_,(iVar9 + TILE_N + -1) / TILE_N);
        local_1b8.cstep = 0;
        local_1b8.data = (Mat *)0x0;
        local_1b8.refcount._0_4_ = 0;
        local_1b8.refcount._4_4_ = 0;
        local_1b8.elemsize._0_4_ = 0;
        local_1b8.elemsize._4_4_ = 0;
        local_1b8.elempack = 0;
        local_1b8.allocator = (Allocator *)0x0;
        local_1b8.dims = 0;
        local_1b8.w = 0;
        local_1b8.h = 0;
        local_1b8.d = 0;
        local_1b8.c = 0;
        Mat::create(&local_1b8,iVar9,4,opt->workspace_allocator);
        iVar15 = -100;
        if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
          local_168.cstep = 0;
          local_168.data = (Mat *)0x0;
          local_168.refcount._0_4_ = 0;
          local_168.refcount._4_4_ = 0;
          local_168.elemsize._0_4_ = 0;
          local_168.elemsize._4_4_ = 0;
          local_168.elempack = 0;
          local_168.allocator = (Allocator *)0x0;
          local_168.dims = 0;
          local_168.w = 0;
          local_168.h = 0;
          local_168.d = 0;
          local_168.c = 0;
          Mat::create(&local_168,iVar9,4,opt->workspace_allocator);
          iVar15 = -100;
          if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
            if ((int)B_int8_scale < 4) {
LAB_004bd23d:
              Mat::create(&m_3,(int)B_int8_scale * iVar25,
                          (iVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar10,1,
                          opt->workspace_allocator);
            }
            else {
              iVar15 = cpu_support_x86_avx512_vnni();
              bVar30 = true;
              if (iVar15 == 0) {
                iVar15 = cpu_support_x86_avx_vnni();
                bVar30 = iVar15 != 0;
              }
              iVar15 = cpu_support_x86_avx_vnni_int8();
              if (!(bool)(bVar30 & iVar15 == 0)) goto LAB_004bd23d;
              iVar15 = 0x40;
              if (((iVar25 < 0x10) && (iVar15 = 0x20, iVar25 < 8)) && (iVar15 = 0x10, iVar25 < 4)) {
                iVar15 = (uint)(1 < iVar25) * 4 + 4;
              }
              Mat::create(&m_3,(iVar15 + (int)B_int8_scale) * iVar25,
                          (iVar13 + (int)B_int8_scale + -1) / (int)B_int8_scale,iVar10,1,
                          opt->workspace_allocator);
            }
            iVar15 = -100;
            if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
              local_348 = CONCAT44(local_348._4_4_,TILE_K);
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              Mat::create(&m,TILE_K * iVar25,1,iVar10,4,opt->workspace_allocator);
              if (m.data == (void *)0x0) {
                iVar15 = -100;
                local_330 = pGVar21;
              }
              else {
                iVar15 = -100;
                local_330 = pGVar21;
                if ((long)m.c * m.cstep != 0) {
                  if (0 < (int)local_d0) {
                    iVar15 = 0;
                    do {
                      if ((int)local_338 == 0) {
                        iVar10 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
                        fVar16 = (float)A->w;
                      }
                      else {
                        iVar10 = A->w;
                        fVar16 = (float)(A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2]);
                      }
                      iVar9 = iVar15 * iVar25;
                      iVar13 = iVar10 - iVar9;
                      if (iVar25 < iVar10 - iVar9) {
                        iVar13 = iVar25;
                      }
                      iVar10 = get_omp_thread_num();
                      uVar18 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                      m_1.data = (void *)((long)iVar10 * m.cstep * uVar18 + (long)m.data);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                      m_1.elemsize._4_4_ = m.elemsize._4_4_;
                      m_1.elempack = m.elempack;
                      m_1.allocator = m.allocator;
                      m_1.w = m.w;
                      m_1.h = m.h;
                      m_1.d = 1;
                      m_1.c = m.d;
                      m_1.dims = m.dims + -1;
                      m_1.cstep = (uVar18 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                                  uVar18;
                      if (m.dims == 4) {
                        m_1.cstep = (long)m.h * (long)m.w;
                      }
                      if (0 < (int)(float)local_310) {
                        iVar10 = 0;
                        local_7c = iVar15;
                        do {
                          iVar15 = (int)(float)local_310 - iVar10;
                          if ((int)local_348 < (int)(float)local_310 - iVar10) {
                            iVar15 = (int)local_348;
                          }
                          if (0 < (int)fVar16) {
                            iVar12 = 0;
                            fVar27 = fVar16;
                            do {
                              max_kk_00 = fVar27;
                              if ((int)B_int8_scale < (int)fVar27) {
                                max_kk_00 = B_int8_scale;
                              }
                              iVar14 = get_omp_thread_num();
                              m_2.cstep = (size_t)m_3.w;
                              m_2.elemsize = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                              m_2.data = (void *)((long)m_3.data +
                                                 m_2.elemsize * m_2.cstep *
                                                 (long)(iVar12 / (int)B_int8_scale) +
                                                 (long)iVar14 * m_3.cstep * m_2.elemsize);
                              m_2.refcount = (int *)0x0;
                              m_2.elempack = m_3.elempack;
                              m_2.allocator = m_3.allocator;
                              m_2.dims = 2;
                              m_2.w = m_3.w;
                              m_2.h = 1;
                              m_2.d = 1;
                              m_2.c = 1;
                              local_9c = (local_330->BT_data).w;
                              local_88 = (size_t)local_9c;
                              local_b8 = (local_330->BT_data).elemsize;
                              _TILE_M = (void *)((long)(local_330->BT_data).data +
                                                local_88 * local_b8 *
                                                (long)(iVar12 / (int)B_int8_scale) +
                                                (long)(iVar10 / (int)local_348) *
                                                (local_330->BT_data).cstep * local_b8);
                              local_b0 = (local_330->BT_data).elempack;
                              local_a8 = (local_330->BT_data).allocator;
                              local_c0 = (int *)0x0;
                              local_a0 = 2;
                              local_98._0_4_ = 1;
                              local_98._4_4_ = 1;
                              local_90 = 1;
                              if (iVar10 == 0) {
                                if (iVar12 == 0) {
                                  if ((int)local_338 != 0) {
                                    transpose_compute_A_tile_int8_scales
                                              (A,(Mat *)local_1b8.data,(float)local_320,
                                               (Mat *)local_168.data,iVar9,iVar13);
                                    goto LAB_004bd663;
                                  }
                                  compute_A_tile_int8_scales
                                            (A,(Mat *)local_1b8.data,(float)local_320,
                                             (Mat *)local_168.data,iVar9,iVar13);
                                }
                                else if ((int)local_338 != 0) {
LAB_004bd663:
                                  transpose_pack_A_tile_quantize
                                            (A,&m_2,iVar9,iVar13,iVar12,(int)max_kk_00,&local_1b8);
                                  goto LAB_004bd6d9;
                                }
                                pack_A_tile_quantize
                                          (A,&m_2,iVar9,iVar13,iVar12,(int)max_kk_00,&local_1b8);
                              }
LAB_004bd6d9:
                              gemm_transB_packed_tile_int8
                                        (&m_2,(Mat *)&TILE_M,&m_1,iVar9,iVar13,iVar10,iVar15,iVar12,
                                         (int)max_kk_00);
                              if (local_c0 != (int *)0x0) {
                                LOCK();
                                *local_c0 = *local_c0 + -1;
                                UNLOCK();
                                if (*local_c0 == 0) {
                                  if (local_a8 == (Allocator *)0x0) {
                                    if (_TILE_M != (void *)0x0) {
                                      free(_TILE_M);
                                    }
                                  }
                                  else {
                                    (*local_a8->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              if (m_2.refcount != (int *)0x0) {
                                LOCK();
                                *m_2.refcount = *m_2.refcount + -1;
                                UNLOCK();
                                if (*m_2.refcount == 0) {
                                  if (m_2.allocator == (Allocator *)0x0) {
                                    if (m_2.data != (void *)0x0) {
                                      free(m_2.data);
                                    }
                                  }
                                  else {
                                    (*(m_2.allocator)->_vptr_Allocator[3])();
                                  }
                                }
                              }
                              iVar12 = iVar12 + (int)B_int8_scale;
                              fVar27 = (float)((int)fVar27 - (int)B_int8_scale);
                            } while (iVar12 < (int)fVar16);
                          }
                          unpack_output_tile_dequantize
                                    (&m_1,&local_258,this_00,broadcast_type_C,iVar9,iVar13,iVar10,
                                     iVar15,&local_168,(float)local_318,(float)local_328,iVar24);
                          iVar15 = local_7c;
                          iVar10 = iVar10 + (int)local_348;
                        } while (iVar10 < (int)(float)local_310);
                        piVar20 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                        if (piVar20 != (int *)0x0) {
                          LOCK();
                          *piVar20 = *piVar20 + -1;
                          UNLOCK();
                          if (*piVar20 == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              if (m_1.data != (void *)0x0) {
                                free(m_1.data);
                              }
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      iVar15 = iVar15 + 1;
                    } while (iVar15 != (int)local_d0);
                  }
                  iVar15 = 0;
                }
              }
              piVar20 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    if (m.data != (void *)0x0) {
                      free(m.data);
                    }
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar20 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar20 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (local_168.allocator == (Allocator *)0x0) {
                if ((Mat *)local_168.data != (Mat *)0x0) {
                  free(local_168.data);
                }
              }
              else {
                (*(local_168.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
        if (piVar20 == (int *)0x0) goto LAB_004bde4a;
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 != 0) goto LAB_004bde4a;
        if (local_1b8.allocator != (Allocator *)0x0) {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
          goto LAB_004bde4a;
        }
      }
    }
    else {
      uVar8 = (pGVar21->super_Gemm).constantM;
      uVar18 = (ulong)uVar8;
      iVar13 = (pGVar21->super_Gemm).constantK;
      iVar15 = (pGVar21->super_Gemm).transB;
      local_348 = CONCAT44(local_348._4_4_,iVar15);
      if (iVar15 == 0) {
        uVar29 = A->w;
      }
      else {
        uVar29 = A->elempack * (&A->h)[(ulong)(A->dims == 3) * 2];
      }
      uVar11 = (ulong)uVar29;
      local_320 = (ulong)(uint)(pGVar21->super_Gemm).output_transpose;
      local_310 = CONCAT44(local_310._4_4_,(pGVar21->super_Gemm).alpha);
      fVar16 = (pGVar21->super_Gemm).beta;
      get_optimal_tile_mnk_int8
                (uVar8,uVar29,iVar13,(pGVar21->super_Gemm).constant_TILE_M,
                 (pGVar21->super_Gemm).constant_TILE_N,(pGVar21->super_Gemm).constant_TILE_K,&TILE_M
                 ,&TILE_N,&TILE_K,iVar10);
      pvVar2 = _TILE_N;
      local_318 = (ulong)_TILE_M & 0xffffffff;
      uVar8 = (int)(uVar8 + TILE_M + -1) / TILE_M;
      iVar24 = (int)(uVar29 + TILE_N + -1) / TILE_N;
      iVar9 = (TILE_K + iVar13 + -1) / TILE_K;
      local_1b8.cstep = 0;
      local_1b8.data = (Mat *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize._0_4_ = 0;
      local_1b8.elemsize._4_4_ = 0;
      local_1b8.elempack = 0;
      local_1b8.allocator = (Allocator *)0x0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      Mat::create(&local_1b8,TILE_K * TILE_N,iVar9,iVar24,1,opt->workspace_allocator);
      iVar15 = -100;
      local_338 = uVar11;
      local_328 = uVar18;
      if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
        compute_B_int8_scale(A,&B_int8_scale);
        local_168.cstep = 0;
        local_168.data = (Mat *)0x0;
        local_168.refcount._0_4_ = 0;
        local_168.refcount._4_4_ = 0;
        local_168.elemsize._0_4_ = 0;
        local_168.elemsize._4_4_ = 0;
        local_168.elempack = 0;
        local_168.allocator = (Allocator *)0x0;
        local_168.dims = 0;
        local_168.w = 0;
        local_168.h = 0;
        local_168.d = 0;
        local_168.c = 0;
        Mat::create(&local_168,(int)local_328,4,opt->workspace_allocator);
        iVar15 = -100;
        if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
          iVar24 = iVar24 * iVar9;
          if (0 < (int)local_328) {
            pvVar3 = (pGVar21->super_Gemm).A_data_int8_scales.data;
            uVar18 = 0;
            do {
              *(float *)((long)(void **)local_168.data + uVar18 * 4) =
                   1.0 / (B_int8_scale * *(float *)((long)pvVar3 + uVar18 * 4));
              uVar18 = uVar18 + 1;
            } while (local_328 != uVar18);
          }
          if (0 < iVar24) {
            iVar25 = 0;
            iVar15 = (int)local_348;
            local_330 = pGVar21;
            do {
              iVar14 = TILE_N * (iVar25 / iVar9);
              iVar23 = TILE_K * (int)((long)iVar25 % (long)iVar9);
              iVar12 = (int)local_338 - iVar14;
              if (TILE_N < iVar12) {
                iVar12 = TILE_N;
              }
              iVar19 = iVar13 - iVar23;
              if (TILE_K < iVar13 - iVar23) {
                iVar19 = TILE_K;
              }
              m_3.cstep = (size_t)local_1b8.w;
              m_3.data = (void *)((long)(void **)local_1b8.data +
                                 ((long)iVar25 % (long)iVar9 & 0xffffffffU) * m_3.cstep *
                                 CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize) +
                                 (long)(iVar25 / iVar9) * local_1b8.cstep *
                                 CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
              m_3.refcount._0_4_ = 0;
              m_3.refcount._4_4_ = 0;
              m_3.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
              m_3.elemsize._4_4_ = local_1b8.elemsize._4_4_;
              m_3.elempack = local_1b8.elempack;
              m_3.allocator = local_1b8.allocator;
              m_3.dims = 2;
              m_3.w = local_1b8.w;
              m_3.h = 1;
              m_3.d = 1;
              m_3.c = 1;
              if (iVar15 == 0) {
                transpose_pack_B_tile_quantize(A,&m_3,iVar14,iVar12,iVar23,iVar19,B_int8_scale);
              }
              else {
                pack_B_tile_quantize(A,&m_3,iVar14,iVar12,iVar23,iVar19,B_int8_scale);
              }
              piVar20 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (m_3.allocator == (Allocator *)0x0) {
                    if (m_3.data != (void *)0x0) {
                      free(m_3.data);
                    }
                  }
                  else {
                    (*(m_3.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar25 = iVar25 + 1;
            } while (iVar24 != iVar25);
            local_318 = (ulong)_TILE_M & 0xffffffff;
            pGVar21 = local_330;
            pvVar2 = _TILE_N;
          }
          iVar9 = (int)pvVar2;
          m_3.cstep = 0;
          m_3.data = (void *)0x0;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = 0;
          m_3.elemsize._4_4_ = 0;
          m_3.elempack = 0;
          m_3.allocator = (Allocator *)0x0;
          m_3.dims = 0;
          m_3.w = 0;
          m_3.h = 0;
          m_3.d = 0;
          m_3.c = 0;
          Mat::create(&m_3,iVar9 * (int)(float)local_318,1,iVar10,4,opt->workspace_allocator);
          iVar15 = -100;
          if ((m_3.data != (void *)0x0) && ((long)m_3.c * m_3.cstep != 0)) {
            if (0 < (int)uVar8) {
              uVar18 = 0;
              uVar11 = local_328;
              do {
                iVar10 = (int)local_318;
                iVar24 = iVar10 * (int)uVar18;
                iVar15 = (int)uVar11 - iVar24;
                if (iVar10 < iVar15) {
                  iVar15 = iVar10;
                }
                iVar10 = get_omp_thread_num();
                uVar17 = CONCAT44(m_3.elemsize._4_4_,(undefined4)m_3.elemsize);
                m.data = (void *)((long)iVar10 * m_3.cstep * uVar17 + (long)m_3.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)m_3.elemsize;
                m.elemsize._4_4_ = m_3.elemsize._4_4_;
                m.elempack = m_3.elempack;
                m.allocator = m_3.allocator;
                m.w = m_3.w;
                m.h = m_3.h;
                m.d = 1;
                m.c = m_3.d;
                m.dims = m_3.dims + -1;
                m.cstep = (uVar17 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar17;
                if (m_3.dims == 4) {
                  m.cstep = (long)m_3.h * (long)m_3.w;
                }
                if (0 < (int)local_338) {
                  iVar10 = 0;
                  local_348 = uVar18;
                  do {
                    iVar25 = (int)local_338 - iVar10;
                    if (iVar9 < iVar25) {
                      iVar25 = iVar9;
                    }
                    if (0 < iVar13) {
                      iVar14 = 0;
                      iVar12 = iVar13;
                      do {
                        iVar23 = iVar12;
                        if (TILE_K < iVar12) {
                          iVar23 = TILE_K;
                        }
                        m_1.w = (pGVar21->AT_data).w;
                        m_1.cstep = (size_t)m_1.w;
                        sVar28 = (pGVar21->AT_data).elemsize;
                        m_1.elempack = (pGVar21->AT_data).elempack;
                        m_1.allocator = (pGVar21->AT_data).allocator;
                        m_1.data = (void *)((long)(pGVar21->AT_data).data +
                                           sVar28 * m_1.cstep * (long)(iVar14 / TILE_K) +
                                           (pGVar21->AT_data).cstep * local_348 * sVar28);
                        m_1.refcount._0_4_ = 0;
                        m_1.refcount._4_4_ = 0;
                        m_1.elemsize._0_4_ = (undefined4)sVar28;
                        m_1.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
                        m_1.dims = 2;
                        m_1.h = 1;
                        m_1.d = 1;
                        m_1.c = 1;
                        m_2.cstep = (size_t)local_1b8.w;
                        m_2.elemsize = CONCAT44(local_1b8.elemsize._4_4_,
                                                (undefined4)local_1b8.elemsize);
                        m_2.data = (void *)((long)(void **)local_1b8.data +
                                           m_2.cstep * m_2.elemsize * (long)(iVar14 / TILE_K) +
                                           local_1b8.cstep * (long)(iVar10 / iVar9) * m_2.elemsize);
                        m_2.refcount = (int *)0x0;
                        m_2.elempack = local_1b8.elempack;
                        m_2.allocator = local_1b8.allocator;
                        m_2.dims = 2;
                        m_2.w = local_1b8.w;
                        m_2.h = 1;
                        m_2.d = 1;
                        m_2.c = 1;
                        gemm_transB_packed_tile_int8
                                  (&m_1,&m_2,&m,iVar24,iVar15,iVar10,iVar25,iVar14,iVar23);
                        if (m_2.refcount != (int *)0x0) {
                          LOCK();
                          *m_2.refcount = *m_2.refcount + -1;
                          UNLOCK();
                          if (*m_2.refcount == 0) {
                            if (m_2.allocator == (Allocator *)0x0) {
                              if (m_2.data != (void *)0x0) {
                                free(m_2.data);
                              }
                            }
                            else {
                              (*(m_2.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        piVar20 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                        if (piVar20 != (int *)0x0) {
                          LOCK();
                          *piVar20 = *piVar20 + -1;
                          UNLOCK();
                          if (*piVar20 == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              if (m_1.data != (void *)0x0) {
                                free(m_1.data);
                              }
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        iVar14 = iVar14 + TILE_K;
                        iVar12 = iVar12 - TILE_K;
                      } while (iVar14 < iVar13);
                    }
                    unpack_output_tile_dequantize
                              (&m,&local_258,this_00,broadcast_type_C,iVar24,iVar15,iVar10,iVar25,
                               &local_168,(float)local_310,fVar16,(int)local_320);
                    uVar11 = local_328;
                    uVar18 = local_348;
                    iVar10 = iVar10 + iVar9;
                  } while (iVar10 < (int)local_338);
                  piVar20 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar20 != (int *)0x0) {
                    LOCK();
                    *piVar20 = *piVar20 + -1;
                    UNLOCK();
                    if (*piVar20 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                }
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar8);
            }
            iVar15 = 0;
          }
          piVar20 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                if (m_3.data != (void *)0x0) {
                  free(m_3.data);
                }
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              if ((Mat *)local_168.data != (Mat *)0x0) {
                free(local_168.data);
              }
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar20 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar20 == (int *)0x0) goto LAB_004bde4a;
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 != 0) goto LAB_004bde4a;
      if (local_1b8.allocator != (Allocator *)0x0) {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
        goto LAB_004bde4a;
      }
    }
  }
  else {
    fVar16 = (pGVar21->super_Gemm).B_data_int8_scale;
    uVar8 = (pGVar21->super_Gemm).constantM;
    uVar11 = (ulong)uVar8;
    iVar13 = (pGVar21->super_Gemm).constantN;
    iVar9 = (pGVar21->super_Gemm).constantK;
    local_338 = (ulong)(uint)(pGVar21->super_Gemm).output_transpose;
    local_320 = CONCAT44(local_320._4_4_,(pGVar21->super_Gemm).alpha);
    local_310 = CONCAT44(local_310._4_4_,(pGVar21->super_Gemm).beta);
    get_optimal_tile_mnk_int8
              (uVar8,iVar13,iVar9,(pGVar21->super_Gemm).constant_TILE_M,
               (pGVar21->super_Gemm).constant_TILE_N,(pGVar21->super_Gemm).constant_TILE_K,
               (int *)&m_2,&TILE_M,&TILE_N,iVar10);
    iVar24 = (int)m_2.data;
    uVar18 = (long)(int)(uVar8 + (int)m_2.data + -1) / (long)(int)m_2.data;
    local_1b8.cstep = 0;
    local_1b8.data = (Mat *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,uVar8,4,opt->workspace_allocator);
    iVar15 = -100;
    local_318 = uVar11;
    if (((Mat *)local_1b8.data != (Mat *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
      if (0 < (int)uVar8) {
        pvVar2 = (pGVar21->super_Gemm).A_data_int8_scales.data;
        uVar17 = 0;
        do {
          *(float *)((long)(void **)local_1b8.data + uVar17 * 4) =
               1.0 / (fVar16 * *(float *)((long)pvVar2 + uVar17 * 4));
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
      iVar25 = TILE_M;
      local_168.cstep = 0;
      local_168.data = (Mat *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      Mat::create(&local_168,TILE_M * iVar24,1,iVar10,4,opt->workspace_allocator);
      iVar15 = -100;
      if (((Mat *)local_168.data != (Mat *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
        if (0 < (int)uVar18) {
          iVar15 = TILE_N;
          uVar11 = 0;
          local_330 = pGVar21;
          local_328 = uVar18 & 0xffffffff;
          do {
            iVar12 = iVar24 * (int)uVar11;
            iVar10 = (int)local_318 - iVar12;
            if (iVar24 < iVar10) {
              iVar10 = iVar24;
            }
            iVar14 = get_omp_thread_num();
            uVar18 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
            m_3.data = (void *)((long)(void **)local_168.data +
                               (long)iVar14 * local_168.cstep * uVar18);
            m_3.refcount._0_4_ = 0;
            m_3.refcount._4_4_ = 0;
            m_3.elemsize._0_4_ = (undefined4)local_168.elemsize;
            m_3.elemsize._4_4_ = local_168.elemsize._4_4_;
            m_3.elempack = local_168.elempack;
            m_3.allocator = local_168.allocator;
            m_3.w = local_168.w;
            m_3.h = local_168.h;
            m_3.d = 1;
            m_3.c = local_168.d;
            m_3.dims = local_168.dims + -1;
            m_3.cstep = (uVar18 * (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0)
                        / uVar18;
            if (local_168.dims == 4) {
              m_3.cstep = (long)local_168.h * (long)local_168.w;
            }
            if (0 < iVar13) {
              iVar14 = 0;
              do {
                iVar23 = iVar13 - iVar14;
                if (iVar25 < iVar13 - iVar14) {
                  iVar23 = iVar25;
                }
                if (0 < iVar9) {
                  local_348 = (ulong)(iVar14 / iVar25);
                  k = 0;
                  iVar19 = iVar9;
                  do {
                    max_kk = iVar19;
                    if (iVar15 < iVar19) {
                      max_kk = iVar15;
                    }
                    m.w = (local_330->AT_data).w;
                    m.cstep = (size_t)m.w;
                    sVar28 = (local_330->AT_data).elemsize;
                    m.elempack = (local_330->AT_data).elempack;
                    m.allocator = (local_330->AT_data).allocator;
                    m.data = (void *)((long)(local_330->AT_data).data +
                                     sVar28 * m.cstep * (long)(k / iVar15) +
                                     (local_330->AT_data).cstep * uVar11 * sVar28);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar28;
                    m.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
                    m.dims = 2;
                    m.h = 1;
                    m.d = 1;
                    m.c = 1;
                    m_1.w = (local_330->BT_data).w;
                    m_1.cstep = (size_t)m_1.w;
                    sVar28 = (local_330->BT_data).elemsize;
                    m_1.elempack = (local_330->BT_data).elempack;
                    m_1.data = (void *)((long)(local_330->BT_data).data +
                                       m_1.cstep * sVar28 * (long)(k / iVar15) +
                                       (local_330->BT_data).cstep * local_348 * sVar28);
                    m_1.allocator = (local_330->BT_data).allocator;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = (undefined4)sVar28;
                    m_1.elemsize._4_4_ = (undefined4)(sVar28 >> 0x20);
                    m_1.dims = 2;
                    m_1.h = 1;
                    m_1.d = 1;
                    m_1.c = 1;
                    gemm_transB_packed_tile_int8(&m,&m_1,&m_3,iVar12,iVar10,iVar14,iVar23,k,max_kk);
                    piVar20 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar20 != (int *)0x0) {
                      LOCK();
                      *piVar20 = *piVar20 + -1;
                      UNLOCK();
                      if (*piVar20 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    piVar20 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar20 != (int *)0x0) {
                      LOCK();
                      *piVar20 = *piVar20 + -1;
                      UNLOCK();
                      if (*piVar20 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    k = k + iVar15;
                    iVar19 = iVar19 - iVar15;
                  } while (k < iVar9);
                }
                unpack_output_tile_dequantize
                          (&m_3,&local_258,this_00,broadcast_type_C,iVar12,iVar10,iVar14,iVar23,
                           &local_1b8,(float)local_320,(float)local_310,(int)local_338);
                iVar14 = iVar14 + iVar25;
              } while (iVar14 < iVar13);
              piVar20 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (m_3.allocator == (Allocator *)0x0) {
                    if (m_3.data != (void *)0x0) {
                      free(m_3.data);
                    }
                  }
                  else {
                    (*(m_3.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != local_328);
        }
        iVar15 = 0;
      }
      piVar20 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if ((Mat *)local_168.data != (Mat *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar20 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar20 == (int *)0x0) goto LAB_004bde4a;
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 != 0) goto LAB_004bde4a;
    if (local_1b8.allocator != (Allocator *)0x0) {
      (*(local_1b8.allocator)->_vptr_Allocator[3])();
      goto LAB_004bde4a;
    }
  }
  if ((Mat *)local_1b8.data != (Mat *)0x0) {
    free(local_1b8.data);
  }
LAB_004bde4a:
  piVar20 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_258.allocator == (Allocator *)0x0) {
        if (local_258.data != (void *)0x0) {
          free(local_258.data);
        }
      }
      else {
        (*(local_258.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Gemm_x86_fma::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // FIXME use output_elempack
    // int output_elempack = out_elempack > 4 ? 4 : out_elempack;

    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    // FIXME use output_elemtype instead of input_elemtype
    // int output_elemtype = input_elemtype;

    // TODO use output_elemtype

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86_int8(AT_data, A_data_int8_scales, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86_int8(AT_data, A_data_int8_scales, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86_int8(A, BT_data, B_data_int8_scale, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86_int8(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, alpha, beta, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    return ret;
}